

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Modules.cpp
# Opt level: O0

string * SoapySDR::getRootPath_abi_cxx11_(void)

{
  ulong uVar1;
  string *in_RDI;
  string rootPathEnv;
  allocator local_39;
  undefined4 local_38;
  string local_28 [16];
  char *in_stack_ffffffffffffffe8;
  
  getEnvImpl_abi_cxx11_(in_stack_ffffffffffffffe8);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(in_RDI,local_28);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"/usr/local",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  local_38 = 1;
  std::__cxx11::string::~string(local_28);
  return in_RDI;
}

Assistant:

std::string SoapySDR::getRootPath(void)
{
    const std::string rootPathEnv = getEnvImpl("SOAPY_SDR_ROOT");
    if (not rootPathEnv.empty()) return rootPathEnv;

    // Get the path to the current dynamic linked library.
    // The path to this library can be used to determine
    // the installation root without prior knowledge.
    #ifdef _MSC_VER
    char path[MAX_PATH];
    HMODULE hm = NULL;
    if (GetModuleHandleExA(
        GET_MODULE_HANDLE_EX_FLAG_FROM_ADDRESS |
        GET_MODULE_HANDLE_EX_FLAG_UNCHANGED_REFCOUNT,
        (LPCSTR) &SoapySDR::getRootPath, &hm))
    {
        const DWORD size = GetModuleFileNameA(hm, path, sizeof(path));
        if (size != 0)
        {
            const std::string libPath(path, size);
            const size_t slash0Pos = libPath.find_last_of("/\\");
            const size_t slash1Pos = libPath.substr(0, slash0Pos).find_last_of("/\\");
            if (slash0Pos != std::string::npos and slash1Pos != std::string::npos)
                return libPath.substr(0, slash1Pos);
        }
    }
    #endif

    return "/usr/local";
}